

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_fighterquietus.cpp
# Opt level: O2

int AF_A_FSwordFlames(VMFrameStack *stack,VMValue *param,int numparam,VMReturn *ret,int numret)

{
  VM_UBYTE VVar1;
  DObject *this;
  bool bVar2;
  uint uVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  AActor *this_00;
  int iVar7;
  char *__assertion;
  FName local_4c;
  DVector3 local_48;
  
  if (numparam < 1) {
    __assertion = "(paramnum) < numparam";
    goto LAB_00539ff9;
  }
  if ((param->field_0).field_3.Type == '\x03') {
    this_00 = (AActor *)(param->field_0).field_1.a;
    if ((param->field_0).field_1.atag == 1) {
      if (this_00 == (AActor *)0x0) {
LAB_00539e91:
        this_00 = (AActor *)0x0;
      }
      else {
        bVar2 = DObject::IsKindOf((DObject *)this_00,AActor::RegistrationInfo.MyClass);
        if (!bVar2) {
          __assertion = "self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))";
          goto LAB_00539ff9;
        }
      }
      if (numparam == 1) goto LAB_00539f11;
      VVar1 = param[1].field_0.field_3.Type;
      if (VVar1 != 0xff) {
        if (VVar1 != '\x03') goto LAB_00539fe9;
        this = (DObject *)param[1].field_0.field_1.a;
        if (param[1].field_0.field_1.atag == 1) {
          if (this != (DObject *)0x0) {
            bVar2 = DObject::IsKindOf(this,AActor::RegistrationInfo.MyClass);
            if (!bVar2) {
              __assertion = "stateowner == NULL || stateowner->IsKindOf(RUNTIME_CLASS(AActor))";
              goto LAB_00539ff9;
            }
          }
        }
        else if (this != (DObject *)0x0) goto LAB_00539fe9;
      }
      if ((((uint)numparam < 3) || (VVar1 = param[2].field_0.field_3.Type, VVar1 == 0xff)) ||
         ((VVar1 == '\x03' &&
          ((param[2].field_0.field_1.atag == 8 || (param[2].field_0.field_1.a == (void *)0x0)))))) {
LAB_00539f11:
        uVar3 = FRandom::operator()(&pr_fswordflame);
        iVar7 = (uVar3 & 3) + 1;
        while (bVar2 = iVar7 != 0, iVar7 = iVar7 + -1, bVar2) {
          iVar4 = FRandom::operator()(&pr_fswordflame);
          iVar5 = FRandom::operator()(&pr_fswordflame);
          iVar6 = FRandom::operator()(&pr_fswordflame);
          FName::FName(&local_4c,"FSwordFlame");
          AActor::Vec3Offset(&local_48,this_00,(double)(iVar4 + -0x80) * 0.0625,
                             (double)(iVar5 + -0x80) * 0.0625,(double)(iVar6 + -0x80) * 0.125,false)
          ;
          Spawn(&local_4c,&local_48,ALLOW_REPLACE);
        }
        return 0;
      }
      __assertion = 
      "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_STATEINFO || param[paramnum].a == NULL)"
      ;
      goto LAB_00539ff9;
    }
    if (this_00 == (AActor *)0x0) goto LAB_00539e91;
  }
LAB_00539fe9:
  __assertion = 
  "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
  ;
LAB_00539ff9:
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/g_hexen/a_fighterquietus.cpp"
                ,0x70,"int AF_A_FSwordFlames(VMFrameStack *, VMValue *, int, VMReturn *, int)");
}

Assistant:

DEFINE_ACTION_FUNCTION(AActor, A_FSwordFlames)
{
	PARAM_ACTION_PROLOGUE;

	int i;

	for (i = 1+(pr_fswordflame()&3); i; i--)
	{
		double xo = (pr_fswordflame() - 128) / 16.;
		double yo = (pr_fswordflame() - 128) / 16.;
		double zo = (pr_fswordflame() - 128) / 8.;
		Spawn ("FSwordFlame", self->Vec3Offset(xo, yo, zo), ALLOW_REPLACE);
	}
	return 0;
}